

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resldexe.cpp
# Opt level: O1

osfildef * __thiscall CResLoader::open_lib_res(CResLoader *this,char *libfile,char *respath)

{
  FILE *__stream;
  CVmImageLoaderMres_resload res_ifc;
  CVmImageLoaderMres local_58;
  char *local_50;
  size_t local_48;
  int local_40;
  uint local_3c;
  char *local_30;
  
  __stream = fopen(libfile,"rb");
  if (__stream == (FILE *)0x0) {
    __stream = (FILE *)0x0;
  }
  else {
    local_58._vptr_CVmImageLoaderMres = (_func_int **)&PTR__CVmImageLoaderMres_resload_00312f10;
    local_50 = respath;
    local_48 = strlen(respath);
    local_40 = 0;
    local_30 = (char *)0x0;
    CVmImageLoader::load_resources_from_fp((osfildef *)__stream,libfile,&local_58);
    if (local_40 == 0) {
      fclose(__stream);
      __stream = (FILE *)0x0;
    }
    else if (local_30 == (char *)0x0) {
      fseek(__stream,(ulong)local_3c,0);
    }
    else {
      fclose(__stream);
      __stream = fopen(local_30,"rb");
    }
    local_58._vptr_CVmImageLoaderMres = (_func_int **)&PTR__CVmImageLoaderMres_resload_00312f10;
    lib_free_str(local_30);
  }
  return (osfildef *)__stream;
}

Assistant:

osfildef *CResLoader::open_lib_res(const char *libfile,
                                   const char *respath)
{
    osfildef *fp;

    /* try opening the file */
    fp = osfoprb(libfile, OSFTT3IMG);
    
    /* if we couldn't open the file, we can't load the resource */
    if (fp == 0)
        return 0;

    /* set up a resource finder for our resource */
    CVmImageLoaderMres_resload res_ifc(respath);
    
    /* load the file, so that we can try finding the resource */
    CVmImageLoader::load_resources_from_fp(fp, libfile, &res_ifc);
    
    /* check to see if we found it */
    if (res_ifc.found_resource())
    {
        /* we got it - check the type */
        if (res_ifc.get_link_fname() != 0)
        {
            /* 
             *   linked local file - close the library file and open the
             *   local file instead 
             */
            osfcls(fp);
            fp = osfoprb(res_ifc.get_link_fname(), OSFOPRB);
        }
        else
        {
            /* embedded resource - seek to the first byte */
            osfseek(fp, res_ifc.get_resource_seek(), OSFSK_SET);
        }

        /* return the library file handle */
        return fp;
    }
    else
    {
        /* didn't find the resource - close the library */
        osfcls(fp);

        /* tell the caller we didn't find the resource */
        return 0;
    }
}